

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_invalidate(Terminal *term)

{
  termchar *ptVar1;
  wchar_t local_18;
  wchar_t local_14;
  wchar_t j;
  wchar_t i;
  Terminal *term_local;
  
  for (local_14 = L'\0'; local_14 < term->rows; local_14 = local_14 + L'\x01') {
    for (local_18 = L'\0'; local_18 < term->cols; local_18 = local_18 + L'\x01') {
      ptVar1 = term->disptext[local_14]->chars;
      ptVar1[local_18].attr = ptVar1[local_18].attr | 0x3ffff;
    }
  }
  term_schedule_update(term);
  return;
}

Assistant:

void term_invalidate(Terminal *term)
{
    int i, j;

    for (i = 0; i < term->rows; i++)
        for (j = 0; j < term->cols; j++)
            term->disptext[i]->chars[j].attr |= ATTR_INVALID;

    term_schedule_update(term);
}